

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O2

XMLReader * __thiscall
xercesc_4_0::ReaderMgr::createReader
          (ReaderMgr *this,XMLCh *sysId,XMLCh *pubId,bool xmlDecl,RefFrom refFrom,Types type,
          Sources source,InputSource **srcToFill,bool calcSrcOfs,XMLSize_t lowWaterMark,
          bool disableDefaultEntityResolution)

{
  uint uVar1;
  XMLEntityHandler *pXVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  XMLSize_t XVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar6;
  InputSource *pIVar7;
  URLInputSource *this_00;
  XMLReader *pXVar8;
  MalformedURLException *this_01;
  undefined7 in_register_00000009;
  XMLBuffer expSysId;
  LastExtEntityInfo lastInfo;
  XMLBuffer normalizedSysId;
  XMLResourceIdentifier resourceIdentifier;
  LastExtEntityInfo lastInfo_1;
  undefined4 extraout_var_02;
  
  normalizedSysId.fMemoryManager = this->fMemoryManager;
  normalizedSysId.fIndex = 0;
  normalizedSysId.fCapacity = 0x3ff;
  normalizedSysId.fFullSize = 0;
  normalizedSysId.fUsed = false;
  normalizedSysId.fFullHandler = (XMLBufferFullHandler *)0x0;
  iVar4 = (*(normalizedSysId.fMemoryManager)->_vptr_MemoryManager[3])
                    (normalizedSysId.fMemoryManager,0x800,pubId,
                     CONCAT71(in_register_00000009,xmlDecl));
  normalizedSysId.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar4);
  *normalizedSysId.fBuffer = L'\0';
  if (sysId == (XMLCh *)0x0) {
    XVar5 = 0;
  }
  else {
    resourceIdentifier.fResourceIdentifierType =
         CONCAT22(resourceIdentifier.fResourceIdentifierType._2_2_,0xffff);
    XMLString::removeChar(sysId,(XMLCh *)&resourceIdentifier,&normalizedSysId);
    XVar5 = normalizedSysId.fIndex;
  }
  pXVar6 = normalizedSysId.fBuffer;
  normalizedSysId.fBuffer[XVar5] = L'\0';
  expSysId.fMemoryManager = this->fMemoryManager;
  expSysId.fIndex = 0;
  expSysId.fCapacity = 0x3ff;
  expSysId.fFullSize = 0;
  expSysId.fUsed = false;
  expSysId.fFullHandler = (XMLBufferFullHandler *)0x0;
  expSysId.fBuffer = (XMLCh *)0x0;
  iVar4 = (*(expSysId.fMemoryManager)->_vptr_MemoryManager[3])(expSysId.fMemoryManager,0x800);
  expSysId.fBuffer = (XMLCh *)CONCAT44(extraout_var_00,iVar4);
  *expSysId.fBuffer = L'\0';
  pXVar2 = this->fEntityHandler;
  if (pXVar2 == (XMLEntityHandler *)0x0) {
LAB_002b0acd:
    XMLBuffer::set(&expSysId,pXVar6);
  }
  else {
    iVar4 = (*pXVar2->_vptr_XMLEntityHandler[3])(pXVar2,pXVar6,&expSysId);
    if ((char)iVar4 == '\0') goto LAB_002b0acd;
  }
  *srcToFill = (InputSource *)0x0;
  if (this->fEntityHandler == (XMLEntityHandler *)0x0) {
LAB_002b0b52:
    if (!disableDefaultEntityResolution) {
      getLastExtEntityInfo(this,&lastInfo_1);
      XMLURL::XMLURL((XMLURL *)&resourceIdentifier,this->fMemoryManager);
      expSysId.fBuffer[expSysId.fIndex] = L'\0';
      bVar3 = XMLURL::setURL((XMLURL *)&resourceIdentifier,lastInfo_1.systemId,expSysId.fBuffer,
                             (XMLURL *)&resourceIdentifier);
      if (bVar3) {
        bVar3 = XMLURL::isRelative((XMLURL *)&resourceIdentifier);
        if (bVar3) goto LAB_002b0bc4;
        if (this->fStandardUriConformant == true) {
          bVar3 = XMLURL::hasInvalidChar((XMLURL *)&resourceIdentifier);
          if (bVar3) {
            this_01 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (this_01,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
                       ,0x273,URL_MalformedURL,this->fMemoryManager);
            goto LAB_002b0d58;
          }
        }
        this_00 = (URLInputSource *)XMemory::operator_new(0x88,this->fMemoryManager);
        URLInputSource::URLInputSource(this_00,(XMLURL *)&resourceIdentifier,this->fMemoryManager);
        *srcToFill = (InputSource *)this_00;
      }
      else {
LAB_002b0bc4:
        if (this->fStandardUriConformant != false) {
          this_01 = (MalformedURLException *)__cxa_allocate_exception(0x30);
          MalformedURLException::MalformedURLException
                    (this_01,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
                     ,0x26e,URL_MalformedURL,this->fMemoryManager);
LAB_002b0d58:
          __cxa_throw(this_01,&MalformedURLException::typeinfo,XMLException::~XMLException);
        }
        lastInfo.systemId = (XMLCh *)0x0;
        lastInfo.publicId = (XMLCh *)0x3ff;
        lastInfo.lineNumber = 0;
        lastInfo.colNumber._0_1_ = 0;
        iVar4 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,0x800);
        pXVar6 = (XMLCh *)CONCAT44(extraout_var_02,iVar4);
        *pXVar6 = L'\0';
        expSysId.fBuffer[expSysId.fIndex] = L'\0';
        XMLUri::normalizeURI(expSysId.fBuffer,(XMLBuffer *)&lastInfo);
        pIVar7 = (InputSource *)XMemory::operator_new(0x30,this->fMemoryManager);
        pXVar6[(long)lastInfo.systemId] = L'\0';
        LocalFileInputSource::LocalFileInputSource
                  ((LocalFileInputSource *)pIVar7,lastInfo_1.systemId,pXVar6,this->fMemoryManager);
        *srcToFill = pIVar7;
        XMLBuffer::~XMLBuffer((XMLBuffer *)&lastInfo);
      }
      XMLURL::~XMLURL((XMLURL *)&resourceIdentifier);
      pIVar7 = *srcToFill;
      goto LAB_002b0cbb;
    }
  }
  else {
    getLastExtEntityInfo(this,&lastInfo);
    expSysId.fBuffer[expSysId.fIndex] = L'\0';
    resourceIdentifier.fResourceIdentifierType = ExternalEntity;
    resourceIdentifier.fSystemId = expSysId.fBuffer;
    resourceIdentifier.fBaseURI = lastInfo.systemId;
    resourceIdentifier.fNameSpace = L"";
    resourceIdentifier.fPublicId = pubId;
    resourceIdentifier.fLocator = &this->super_Locator;
    iVar4 = (*this->fEntityHandler->_vptr_XMLEntityHandler[5])();
    pIVar7 = (InputSource *)CONCAT44(extraout_var_01,iVar4);
    *srcToFill = pIVar7;
    if (pIVar7 == (InputSource *)0x0) goto LAB_002b0b52;
LAB_002b0cbb:
    pXVar8 = createReader(this,pIVar7,false,refFrom,type,source,calcSrcOfs,lowWaterMark);
    if (pXVar8 != (XMLReader *)0x0) {
      uVar1 = this->fNextReaderNum;
      this->fNextReaderNum = uVar1 + 1;
      pXVar8->fReaderNum = (ulong)uVar1;
      goto LAB_002b0d09;
    }
  }
  pXVar8 = (XMLReader *)0x0;
LAB_002b0d09:
  XMLBuffer::~XMLBuffer(&expSysId);
  XMLBuffer::~XMLBuffer(&normalizedSysId);
  return pXVar8;
}

Assistant:

XMLReader* ReaderMgr::createReader( const   XMLCh* const        sysId
                                    , const XMLCh* const        pubId
                                    , const bool                xmlDecl
                                    , const XMLReader::RefFrom  refFrom
                                    , const XMLReader::Types    type
                                    , const XMLReader::Sources  source
                                    ,       InputSource*&       srcToFill
                                    , const bool                calcSrcOfs
                                    ,       XMLSize_t           lowWaterMark
                                    , const bool                disableDefaultEntityResolution)
{
    //Normalize sysId
    XMLBuffer normalizedSysId(1023, fMemoryManager);
    if(sysId)
        XMLString::removeChar(sysId, 0xFFFF, normalizedSysId);
    const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

    // Create a buffer for expanding the system id
    XMLBuffer expSysId(1023, fMemoryManager);

    //
    //  Allow the entity handler to expand the system id if they choose
    //  to do so.
    //
    if (fEntityHandler)
    {
        if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
            expSysId.set(normalizedURI);
    }
     else
    {
        expSysId.set(normalizedURI);
    }

    // Call the entity resolver interface to get an input source
    srcToFill = 0;
    if (fEntityHandler)
    {
        LastExtEntityInfo lastInfo;
        getLastExtEntityInfo(lastInfo);
        XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::ExternalEntity,
                            expSysId.getRawBuffer(), XMLUni::fgZeroLenString, pubId, lastInfo.systemId,
                            this);
        srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
    }

    //
    //  If they didn't create a source via the entity resolver, then we
    //  have to create one on our own.
    //
    if (!srcToFill)
    {
        if (disableDefaultEntityResolution)
            return 0;

        LastExtEntityInfo lastInfo;
        getLastExtEntityInfo(lastInfo);

// Keep this #if 0 block as it was exposing a threading problem on AIX.
// Got rid of the problem by changing XMLURL to not throw malformedurl
// exceptions.
#if 0
        try
        {
            XMLURL urlTmp(lastInfo.systemId, expSysId.getRawBuffer(), fMemoryManager);
            if (urlTmp.isRelative())
            {
                ThrowXMLwithMemMgr
                (
                    MalformedURLException
                    , XMLExcepts::URL_NoProtocolPresent
                    , fMemoryManager
                );
            }
            else {
                if (fStandardUriConformant && urlTmp.hasInvalidChar())
                    ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
                srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
            }
        }

        catch(const MalformedURLException& e)
        {
            // Its not a URL, so lets assume its a local file name if non-standard uri is allowed
            if (!fStandardUriConformant)
                srcToFill = new (fMemoryManager) LocalFileInputSource
                (
                    lastInfo.systemId
                    , expSysId.getRawBuffer()
                    , fMemoryManager
                );
            else
                throw e;
        }
#else
        XMLURL urlTmp(fMemoryManager);
        if ((!urlTmp.setURL(lastInfo.systemId, expSysId.getRawBuffer(), urlTmp)) ||
            (urlTmp.isRelative()))
        {
            if (!fStandardUriConformant)
            {
                XMLBuffer resolvedSysId(1023, fMemoryManager);
                XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                srcToFill = new (fMemoryManager) LocalFileInputSource
                (
                    lastInfo.systemId
                    , resolvedSysId.getRawBuffer()
                    , fMemoryManager
                );
            }
            else
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
        }
        else
        {
            if (fStandardUriConformant && urlTmp.hasInvalidChar())
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
        }
#endif
    }

    // Put a janitor on the input source
    Janitor<InputSource> janSrc(srcToFill);

    //
    //  Now call the other version with the input source that we have, and
    //  return the resulting reader.
    //
    XMLReader* retVal = createReader
    (
        *srcToFill
        , xmlDecl
        , refFrom
        , type
        , source
        , calcSrcOfs
        , lowWaterMark
    );

    // Either way, we can release the input source now
    janSrc.orphan();

    // If it failed for any reason, then return zero.
    if (!retVal)
        return 0;

    // Give this reader the next available reader number and return it
    retVal->setReaderNum(fNextReaderNum++);
    return retVal;
}